

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O2

void __thiscall
ktxValidator::validateDxgiFormat
          (ktxValidator *this,validationContext *param_1,char *key,uint8_t *param_3,
          uint32_t valueLen)

{
  undefined1 local_40 [40];
  
  if (valueLen != 4) {
    ::issue::issue((issue *)local_40,&Metadata.InvalidValue);
    addIssue<char_const*>(this,eError,(issue *)local_40,key);
    std::__cxx11::string::~string((string *)(local_40 + 8));
  }
  return;
}

Assistant:

void
ktxValidator::validateDxgiFormat(validationContext& /*ctx*/,
                                 const char* key,
                                 const uint8_t* /*value*/,
                                 uint32_t valueLen)
                            {
    if (valueLen != sizeof(uint32_t))
        addIssue(logger::eError, Metadata.InvalidValue, key);}